

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O0

int xc_number_of_functionals(void)

{
  int num;
  
  num = 0;
  while (xc_functional_keys[num].number != -1) {
    num = num + 1;
  }
  return num;
}

Assistant:

int xc_number_of_functionals(void)
{
  int num;

  for(num=0;;num++){
    if(xc_functional_keys[num].number == -1)
      return num;
  }

  fprintf(stderr, "Internal error in functionals.c\n");
  exit(1);
}